

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O2

bool __thiscall
duckdb::ART::SearchGreater
          (ART *this,ARTKey *key,bool equal,idx_t max_count,unsafe_vector<row_t> *row_ids)

{
  bool bVar1;
  bool bVar2;
  Iterator it;
  ARTKey AStack_c8;
  Iterator local_b8;
  
  bVar2 = true;
  if (*(char *)((long)&(this->tree).super_IndexPointer.data + 7) != '\0') {
    Iterator::Iterator(&local_b8,this);
    bVar1 = Iterator::LowerBound(&local_b8,&this->tree,key,equal,0);
    bVar2 = true;
    if (bVar1) {
      ARTKey::ARTKey(&AStack_c8);
      bVar2 = Iterator::Scan(&local_b8,&AStack_c8,max_count,row_ids,false);
    }
    Iterator::~Iterator(&local_b8);
  }
  return bVar2;
}

Assistant:

bool ART::SearchGreater(ARTKey &key, bool equal, idx_t max_count, unsafe_vector<row_t> &row_ids) {
	if (!tree.HasMetadata()) {
		return true;
	}

	// Find the lowest value that satisfies the predicate.
	Iterator it(*this);

	// Early-out, if the maximum value in the ART is lower than the lower bound.
	if (!it.LowerBound(tree, key, equal, 0)) {
		return true;
	}

	// We continue the scan. We do not check the bounds as any value following this value is
	// greater and satisfies our predicate.
	return it.Scan(ARTKey(), max_count, row_ids, false);
}